

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int read_line_header_format_entries
              (backtrace_state *state,dwarf_data *ddata,unit *u,dwarf_buf *hdr_buf,line_header *hdr,
              size_t *pcount,char ***ppaths)

{
  byte bVar1;
  int iVar2;
  ulong formats_count_00;
  uint64_t uVar3;
  char **p;
  int local_6c;
  ulong uStack_68;
  int ret;
  size_t i;
  char **paths;
  size_t paths_count;
  line_header_format *formats;
  size_t formats_count;
  size_t *pcount_local;
  line_header *hdr_local;
  dwarf_buf *hdr_buf_local;
  unit *u_local;
  dwarf_data *ddata_local;
  backtrace_state *state_local;
  
  bVar1 = read_byte(hdr_buf);
  formats_count_00 = (ulong)bVar1;
  if (formats_count_00 == 0) {
    paths_count = 0;
  }
  else {
    paths_count = (size_t)tcmalloc_backtrace_alloc
                                    (state,formats_count_00 << 3,hdr_buf->error_callback,
                                     hdr_buf->data);
    if ((void *)paths_count == (void *)0x0) {
      return 0;
    }
    for (uStack_68 = 0; uStack_68 < formats_count_00; uStack_68 = uStack_68 + 1) {
      uVar3 = read_uleb128(hdr_buf);
      *(int *)(paths_count + uStack_68 * 8) = (int)uVar3;
      uVar3 = read_uleb128(hdr_buf);
      *(int *)(paths_count + uStack_68 * 8 + 4) = (int)uVar3;
    }
  }
  uVar3 = read_uleb128(hdr_buf);
  if (uVar3 == 0) {
    *pcount = 0;
    *ppaths = (char **)0x0;
    local_6c = 1;
  }
  else {
    p = (char **)tcmalloc_backtrace_alloc(state,uVar3 << 3,hdr_buf->error_callback,hdr_buf->data);
    if (p == (char **)0x0) {
      local_6c = 0;
    }
    else {
      for (uStack_68 = 0; uStack_68 < uVar3; uStack_68 = uStack_68 + 1) {
        iVar2 = read_lnct(state,ddata,u,hdr_buf,hdr,formats_count_00,
                          (line_header_format *)paths_count,p + uStack_68);
        if (iVar2 == 0) {
          tcmalloc_backtrace_free(state,p,uVar3 << 3,hdr_buf->error_callback,hdr_buf->data);
          local_6c = 0;
          goto LAB_001604ae;
        }
      }
      *pcount = uVar3;
      *ppaths = p;
      local_6c = 1;
    }
  }
LAB_001604ae:
  if (paths_count != 0) {
    tcmalloc_backtrace_free
              (state,(void *)paths_count,formats_count_00 << 3,hdr_buf->error_callback,hdr_buf->data
              );
  }
  return local_6c;
}

Assistant:

static int
read_line_header_format_entries (struct backtrace_state *state,
				 struct dwarf_data *ddata,
				 struct unit *u,
				 struct dwarf_buf *hdr_buf,
				 struct line_header *hdr,
				 size_t *pcount,
				 const char ***ppaths)
{
  size_t formats_count;
  struct line_header_format *formats;
  size_t paths_count;
  const char **paths;
  size_t i;
  int ret;

  formats_count = read_byte (hdr_buf);
  if (formats_count == 0)
    formats = NULL;
  else
    {
      formats = ((struct line_header_format *)
		 backtrace_alloc (state,
				  (formats_count
				   * sizeof (struct line_header_format)),
				  hdr_buf->error_callback,
				  hdr_buf->data));
      if (formats == NULL)
	return 0;

      for (i = 0; i < formats_count; i++)
	{
	  formats[i].lnct = (int) read_uleb128(hdr_buf);
	  formats[i].form = (enum dwarf_form) read_uleb128 (hdr_buf);
	}
    }

  paths_count = read_uleb128 (hdr_buf);
  if (paths_count == 0)
    {
      *pcount = 0;
      *ppaths = NULL;
      ret = 1;
      goto exit;
    }

  paths = ((const char **)
	   backtrace_alloc (state, paths_count * sizeof (const char *),
			    hdr_buf->error_callback, hdr_buf->data));
  if (paths == NULL)
    {
      ret = 0;
      goto exit;
    }
  for (i = 0; i < paths_count; i++)
    {
      if (!read_lnct (state, ddata, u, hdr_buf, hdr, formats_count,
		      formats, &paths[i]))
	{
	  backtrace_free (state, paths,
			  paths_count * sizeof (const char *),
			  hdr_buf->error_callback, hdr_buf->data);
	  ret = 0;
	  goto exit;
	}
    }

  *pcount = paths_count;
  *ppaths = paths;

  ret = 1;

 exit:
  if (formats != NULL)
    backtrace_free (state, formats,
		    formats_count * sizeof (struct line_header_format),
		    hdr_buf->error_callback, hdr_buf->data);

  return  ret;
}